

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O0

void fdct64_stage2_avx2(__m256i *x1,__m256i *x2,__m256i *cospi_m32,__m256i *cospi_p32,
                       __m256i *__rounding,int8_t cos_bit)

{
  undefined1 auVar1 [32];
  undefined1 auVar2 [32];
  undefined8 uVar3;
  undefined8 uVar4;
  undefined8 uVar5;
  undefined1 (*in_RCX) [32];
  undefined1 (*in_RDX) [32];
  undefined1 (*in_RSI) [32];
  undefined1 (*in_RDI) [32];
  undefined1 (*in_R8) [32];
  char in_R9B;
  __m256i in1_w0_7;
  __m256i in0_w1_7;
  __m256i in1_w1_7;
  __m256i in0_w0_7;
  __m256i in1_w0_6;
  __m256i in0_w1_6;
  __m256i in1_w1_6;
  __m256i in0_w0_6;
  __m256i in1_w0_5;
  __m256i in0_w1_5;
  __m256i in1_w1_5;
  __m256i in0_w0_5;
  __m256i in1_w0_4;
  __m256i in0_w1_4;
  __m256i in1_w1_4;
  __m256i in0_w0_4;
  __m256i in1_w0_3;
  __m256i in0_w1_3;
  __m256i in1_w1_3;
  __m256i in0_w0_3;
  __m256i in1_w0_2;
  __m256i in0_w1_2;
  __m256i in1_w1_2;
  __m256i in0_w0_2;
  __m256i in1_w0_1;
  __m256i in0_w1_1;
  __m256i in1_w1_1;
  __m256i in0_w0_1;
  __m256i in1_w0;
  __m256i in0_w1;
  __m256i in1_w1;
  __m256i in0_w0;
  
  auVar1 = vpaddd_avx2(*in_RDI,in_RDI[0x1f]);
  *in_RSI = auVar1;
  auVar1 = vpsubd_avx2(*in_RDI,in_RDI[0x1f]);
  in_RSI[0x1f] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[1],in_RDI[0x1e]);
  in_RSI[1] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[1],in_RDI[0x1e]);
  in_RSI[0x1e] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[2],in_RDI[0x1d]);
  in_RSI[2] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[2],in_RDI[0x1d]);
  in_RSI[0x1d] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[3],in_RDI[0x1c]);
  in_RSI[3] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[3],in_RDI[0x1c]);
  in_RSI[0x1c] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[4],in_RDI[0x1b]);
  in_RSI[4] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[4],in_RDI[0x1b]);
  in_RSI[0x1b] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[5],in_RDI[0x1a]);
  in_RSI[5] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[5],in_RDI[0x1a]);
  in_RSI[0x1a] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[6],in_RDI[0x19]);
  in_RSI[6] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[6],in_RDI[0x19]);
  in_RSI[0x19] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[7],in_RDI[0x18]);
  in_RSI[7] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[7],in_RDI[0x18]);
  in_RSI[0x18] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[8],in_RDI[0x17]);
  in_RSI[8] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[8],in_RDI[0x17]);
  in_RSI[0x17] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[9],in_RDI[0x16]);
  in_RSI[9] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[9],in_RDI[0x16]);
  in_RSI[0x16] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[10],in_RDI[0x15]);
  in_RSI[10] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[10],in_RDI[0x15]);
  in_RSI[0x15] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0xb],in_RDI[0x14]);
  in_RSI[0xb] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0xb],in_RDI[0x14]);
  in_RSI[0x14] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0xc],in_RDI[0x13]);
  in_RSI[0xc] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0xc],in_RDI[0x13]);
  in_RSI[0x13] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0xd],in_RDI[0x12]);
  in_RSI[0xd] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0xd],in_RDI[0x12]);
  in_RSI[0x12] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0xe],in_RDI[0x11]);
  in_RSI[0xe] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0xe],in_RDI[0x11]);
  in_RSI[0x11] = auVar1;
  auVar1 = vpaddd_avx2(in_RDI[0xf],in_RDI[0x10]);
  in_RSI[0xf] = auVar1;
  auVar1 = vpsubd_avx2(in_RDI[0xf],in_RDI[0x10]);
  in_RSI[0x10] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0x20] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x20] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x20] + 0x18);
  *(undefined8 *)in_RSI[0x20] = *(undefined8 *)in_RDI[0x20];
  *(undefined8 *)(in_RSI[0x20] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x20] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x20] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x21] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x21] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x21] + 0x18);
  *(undefined8 *)in_RSI[0x21] = *(undefined8 *)in_RDI[0x21];
  *(undefined8 *)(in_RSI[0x21] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x21] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x21] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x22] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x22] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x22] + 0x18);
  *(undefined8 *)in_RSI[0x22] = *(undefined8 *)in_RDI[0x22];
  *(undefined8 *)(in_RSI[0x22] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x22] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x22] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x23] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x23] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x23] + 0x18);
  *(undefined8 *)in_RSI[0x23] = *(undefined8 *)in_RDI[0x23];
  *(undefined8 *)(in_RSI[0x23] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x23] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x23] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x24] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x24] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x24] + 0x18);
  *(undefined8 *)in_RSI[0x24] = *(undefined8 *)in_RDI[0x24];
  *(undefined8 *)(in_RSI[0x24] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x24] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x24] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x25] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x25] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x25] + 0x18);
  *(undefined8 *)in_RSI[0x25] = *(undefined8 *)in_RDI[0x25];
  *(undefined8 *)(in_RSI[0x25] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x25] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x25] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x26] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x26] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x26] + 0x18);
  *(undefined8 *)in_RSI[0x26] = *(undefined8 *)in_RDI[0x26];
  *(undefined8 *)(in_RSI[0x26] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x26] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x26] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x27] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x27] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x27] + 0x18);
  *(undefined8 *)in_RSI[0x27] = *(undefined8 *)in_RDI[0x27];
  *(undefined8 *)(in_RSI[0x27] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x27] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x27] + 0x18) = uVar5;
  auVar1 = vpmulld_avx2(in_RDI[0x28],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x37],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x28] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x28],*in_R8);
  in_RSI[0x28] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x28],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x28] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x28],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x37],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x37] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x37],*in_R8);
  in_RSI[0x37] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x37],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x37] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x29],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x36],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x29] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x29],*in_R8);
  in_RSI[0x29] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x29],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x29] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x29],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x36],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x36] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x36],*in_R8);
  in_RSI[0x36] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x36],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x36] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2a],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x35],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2a] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2a],*in_R8);
  in_RSI[0x2a] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2a],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x2a] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2a],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x35],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x35] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x35],*in_R8);
  in_RSI[0x35] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x35],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x35] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2b],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x34],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2b] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2b],*in_R8);
  in_RSI[0x2b] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2b],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x2b] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2b],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x34],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x34] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x34],*in_R8);
  in_RSI[0x34] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x34],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x34] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2c],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x33],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2c] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2c],*in_R8);
  in_RSI[0x2c] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2c],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x2c] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2c],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x33],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x33] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x33],*in_R8);
  in_RSI[0x33] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x33],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x33] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2d],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x32],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2d] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2d],*in_R8);
  in_RSI[0x2d] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2d],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x2d] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2d],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x32],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x32] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x32],*in_R8);
  in_RSI[0x32] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x32],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x32] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2e],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x31],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2e] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2e],*in_R8);
  in_RSI[0x2e] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2e],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x2e] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2e],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x31],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x31] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x31],*in_R8);
  in_RSI[0x31] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x31],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x31] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2f],*in_RDX);
  auVar2 = vpmulld_avx2(in_RDI[0x30],*in_RCX);
  auVar1 = vpaddd_avx2(auVar1,auVar2);
  in_RSI[0x2f] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x2f],*in_R8);
  in_RSI[0x2f] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x2f],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x2f] = auVar1;
  auVar1 = vpmulld_avx2(in_RDI[0x2f],*in_RCX);
  auVar2 = vpmulld_avx2(in_RDI[0x30],*in_RDX);
  auVar1 = vpsubd_avx2(auVar1,auVar2);
  in_RSI[0x30] = auVar1;
  auVar1 = vpaddd_avx2(in_RSI[0x30],*in_R8);
  in_RSI[0x30] = auVar1;
  auVar1 = vpsrad_avx2(in_RSI[0x30],ZEXT416((uint)(int)in_R9B));
  in_RSI[0x30] = auVar1;
  uVar3 = *(undefined8 *)(in_RDI[0x38] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x38] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x38] + 0x18);
  *(undefined8 *)in_RSI[0x38] = *(undefined8 *)in_RDI[0x38];
  *(undefined8 *)(in_RSI[0x38] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x38] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x38] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x39] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x39] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x39] + 0x18);
  *(undefined8 *)in_RSI[0x39] = *(undefined8 *)in_RDI[0x39];
  *(undefined8 *)(in_RSI[0x39] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x39] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x39] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3a] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3a] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3a] + 0x18);
  *(undefined8 *)in_RSI[0x3a] = *(undefined8 *)in_RDI[0x3a];
  *(undefined8 *)(in_RSI[0x3a] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3a] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3a] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3b] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3b] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3b] + 0x18);
  *(undefined8 *)in_RSI[0x3b] = *(undefined8 *)in_RDI[0x3b];
  *(undefined8 *)(in_RSI[0x3b] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3b] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3b] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3c] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3c] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3c] + 0x18);
  *(undefined8 *)in_RSI[0x3c] = *(undefined8 *)in_RDI[0x3c];
  *(undefined8 *)(in_RSI[0x3c] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3c] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3c] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3d] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3d] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3d] + 0x18);
  *(undefined8 *)in_RSI[0x3d] = *(undefined8 *)in_RDI[0x3d];
  *(undefined8 *)(in_RSI[0x3d] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3d] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3d] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3e] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3e] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3e] + 0x18);
  *(undefined8 *)in_RSI[0x3e] = *(undefined8 *)in_RDI[0x3e];
  *(undefined8 *)(in_RSI[0x3e] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3e] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3e] + 0x18) = uVar5;
  uVar3 = *(undefined8 *)(in_RDI[0x3f] + 8);
  uVar4 = *(undefined8 *)(in_RDI[0x3f] + 0x10);
  uVar5 = *(undefined8 *)(in_RDI[0x3f] + 0x18);
  *(undefined8 *)in_RSI[0x3f] = *(undefined8 *)in_RDI[0x3f];
  *(undefined8 *)(in_RSI[0x3f] + 8) = uVar3;
  *(undefined8 *)(in_RSI[0x3f] + 0x10) = uVar4;
  *(undefined8 *)(in_RSI[0x3f] + 0x18) = uVar5;
  return;
}

Assistant:

static inline void fdct64_stage2_avx2(__m256i *x1, __m256i *x2,
                                      __m256i *cospi_m32, __m256i *cospi_p32,
                                      const __m256i *__rounding,
                                      int8_t cos_bit) {
  x2[0] = _mm256_add_epi32(x1[0], x1[31]);
  x2[31] = _mm256_sub_epi32(x1[0], x1[31]);
  x2[1] = _mm256_add_epi32(x1[1], x1[30]);
  x2[30] = _mm256_sub_epi32(x1[1], x1[30]);
  x2[2] = _mm256_add_epi32(x1[2], x1[29]);
  x2[29] = _mm256_sub_epi32(x1[2], x1[29]);
  x2[3] = _mm256_add_epi32(x1[3], x1[28]);
  x2[28] = _mm256_sub_epi32(x1[3], x1[28]);
  x2[4] = _mm256_add_epi32(x1[4], x1[27]);
  x2[27] = _mm256_sub_epi32(x1[4], x1[27]);
  x2[5] = _mm256_add_epi32(x1[5], x1[26]);
  x2[26] = _mm256_sub_epi32(x1[5], x1[26]);
  x2[6] = _mm256_add_epi32(x1[6], x1[25]);
  x2[25] = _mm256_sub_epi32(x1[6], x1[25]);
  x2[7] = _mm256_add_epi32(x1[7], x1[24]);
  x2[24] = _mm256_sub_epi32(x1[7], x1[24]);
  x2[8] = _mm256_add_epi32(x1[8], x1[23]);
  x2[23] = _mm256_sub_epi32(x1[8], x1[23]);
  x2[9] = _mm256_add_epi32(x1[9], x1[22]);
  x2[22] = _mm256_sub_epi32(x1[9], x1[22]);
  x2[10] = _mm256_add_epi32(x1[10], x1[21]);
  x2[21] = _mm256_sub_epi32(x1[10], x1[21]);
  x2[11] = _mm256_add_epi32(x1[11], x1[20]);
  x2[20] = _mm256_sub_epi32(x1[11], x1[20]);
  x2[12] = _mm256_add_epi32(x1[12], x1[19]);
  x2[19] = _mm256_sub_epi32(x1[12], x1[19]);
  x2[13] = _mm256_add_epi32(x1[13], x1[18]);
  x2[18] = _mm256_sub_epi32(x1[13], x1[18]);
  x2[14] = _mm256_add_epi32(x1[14], x1[17]);
  x2[17] = _mm256_sub_epi32(x1[14], x1[17]);
  x2[15] = _mm256_add_epi32(x1[15], x1[16]);
  x2[16] = _mm256_sub_epi32(x1[15], x1[16]);
  x2[32] = x1[32];
  x2[33] = x1[33];
  x2[34] = x1[34];
  x2[35] = x1[35];
  x2[36] = x1[36];
  x2[37] = x1[37];
  x2[38] = x1[38];
  x2[39] = x1[39];
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x1[40], x1[55], x2[40], x2[55],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x1[41], x1[54], x2[41], x2[54],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x1[42], x1[53], x2[42], x2[53],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x1[43], x1[52], x2[43], x2[52],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x1[44], x1[51], x2[44], x2[51],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x1[45], x1[50], x2[45], x2[50],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x1[46], x1[49], x2[46], x2[49],
                        *__rounding, cos_bit);
  btf_32_type0_avx2_new(*cospi_m32, *cospi_p32, x1[47], x1[48], x2[47], x2[48],
                        *__rounding, cos_bit);
  x2[56] = x1[56];
  x2[57] = x1[57];
  x2[58] = x1[58];
  x2[59] = x1[59];
  x2[60] = x1[60];
  x2[61] = x1[61];
  x2[62] = x1[62];
  x2[63] = x1[63];
}